

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong uVar44;
  ulong uVar45;
  undefined8 uVar46;
  char *pcVar47;
  ulong uVar48;
  
  secp256k1_fe_verify(a);
  secp256k1_fe_verify_magnitude(a,8);
  uVar45 = a->n[0];
  if (uVar45 >> 0x38 == 0) {
    uVar1 = a->n[1];
    if (uVar1 < 0x100000000000000) {
      uVar2 = a->n[2];
      if (uVar2 < 0x100000000000000) {
        uVar3 = a->n[3];
        if (uVar3 < 0x100000000000000) {
          uVar4 = a->n[4];
          if (uVar4 >> 0x34 == 0) {
            uVar44 = uVar45 * 2;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar3;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar44;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar2;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar1 * 2;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar4;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar4;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = SUB168(auVar7 * auVar28,0);
            auVar8 = auVar6 * auVar27 + auVar5 * auVar26 + auVar8 * ZEXT816(0x1000003d10);
            uVar4 = uVar4 * 2;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar4;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar45;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar3;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar1 * 2;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = uVar2;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar2;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = SUB168(auVar7 * auVar28,8);
            auVar5 = auVar12 * ZEXT816(0x1000003d10000) +
                     auVar9 * auVar29 + auVar11 * auVar31 + auVar10 * auVar30 + (auVar8 >> 0x34);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = uVar45;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar45;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = uVar4;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar1;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = uVar3;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = uVar2 * 2;
            auVar6 = auVar15 * auVar34 + auVar14 * auVar33 + (auVar5 >> 0x34);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
            auVar7 = auVar16 * ZEXT816(0x1000003d1) + auVar13 * auVar32;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = uVar1;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar44;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = uVar4;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar2;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = uVar3;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar3;
            auVar6 = auVar19 * auVar37 + auVar18 * auVar36 + (auVar6 >> 0x34);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
            auVar9 = (auVar7 >> 0x34) + auVar20 * ZEXT816(0x1000003d10) + auVar17 * auVar35;
            uVar45 = auVar9._0_8_;
            uVar48 = auVar9._8_8_;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar2;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar44;
            auVar41._8_8_ = uVar48 >> 0x34;
            auVar41._0_8_ = uVar48 * 0x1000 | uVar45 >> 0x34;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = uVar1;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar1;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = uVar4;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = uVar3;
            auVar6 = auVar23 * auVar40 + (auVar6 >> 0x34);
            r->n[0] = auVar7._0_8_ & 0xfffffffffffff;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = auVar6._0_8_;
            r->n[1] = uVar45 & 0xfffffffffffff;
            auVar41 = auVar24 * ZEXT816(0x1000003d10) + auVar22 * auVar39 + auVar21 * auVar38 +
                      auVar41;
            auVar7 = auVar41 >> 0x34;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = auVar7._0_8_;
            auVar42._8_8_ = auVar7._8_8_;
            auVar42._0_8_ = auVar8._0_8_ & 0xffffffffffffe;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = auVar6._8_8_;
            r->n[2] = auVar41._0_8_ & 0xfffffffffffff;
            auVar43 = auVar25 * ZEXT816(0x1000003d10000) + auVar42 + auVar43;
            uVar45 = auVar43._0_8_;
            r->n[3] = uVar45 & 0xfffffffffffff;
            r->n[4] = (auVar43._8_8_ << 0xc | uVar45 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
            r->magnitude = 1;
            r->normalized = 0;
            secp256k1_fe_verify(r);
            return;
          }
          pcVar47 = "test condition failed: ((a[4]) >> (52)) == 0";
          uVar46 = 0xa4;
        }
        else {
          pcVar47 = "test condition failed: ((a[3]) >> (56)) == 0";
          uVar46 = 0xa3;
        }
      }
      else {
        pcVar47 = "test condition failed: ((a[2]) >> (56)) == 0";
        uVar46 = 0xa2;
      }
    }
    else {
      pcVar47 = "test condition failed: ((a[1]) >> (56)) == 0";
      uVar46 = 0xa1;
    }
  }
  else {
    pcVar47 = "test condition failed: ((a[0]) >> (56)) == 0";
    uVar46 = 0xa0;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/field_5x52_int128_impl.h"
          ,uVar46,pcVar47);
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);

    secp256k1_fe_impl_sqr(r, a);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}